

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
          (TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*> *this)

{
  FIntermissionAction *pFVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>).Array[uVar3];
      if (pFVar1 != (FIntermissionAction *)0x0) {
        (*pFVar1->_vptr_FIntermissionAction[1])();
        uVar2 = (this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<FIntermissionAction_*,_FIntermissionAction_*>::~TArray
            (&this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}